

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O1

int tnt_schema_add_indexes(tnt_schema *schema_obj,tnt_reply *r)

{
  byte bVar1;
  mh_assoc_t *pmVar2;
  undefined8 uVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  undefined8 *puVar9;
  void *__dest;
  uint uVar10;
  char *arg;
  long lVar11;
  uint len;
  assoc_val ***ret;
  assoc_val ***ret_00;
  uint uVar12;
  long lVar13;
  uint uVar14;
  assoc_val **ppaVar15;
  uint *node;
  byte **data;
  undefined8 *puVar16;
  undefined8 *ptr;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  assoc_val *local_50;
  assoc_val *index_number;
  assoc_val *index_string;
  byte *local_38;
  char *tuple;
  
  pmVar2 = schema_obj->space_hash;
  local_38 = (byte *)r->data;
  data = &local_38;
  node = (uint *)r->data_end;
  iVar6 = mp_check((char **)data,(char *)node);
  if (iVar6 != 0) {
    return -1;
  }
  pbVar18 = (byte *)r->data;
  bVar1 = *pbVar18;
  if (mp_type_hint[bVar1] != MP_ARRAY) {
    return -1;
  }
  local_38 = pbVar18 + 1;
  if ((bVar1 & 0x40) == 0) {
    uVar12 = bVar1 & 0xf;
  }
  else if ((bVar1 & 1) == 0) {
    local_38 = pbVar18 + 3;
    uVar12 = (uint)(ushort)(*(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8);
  }
  else {
    uVar12 = *(uint *)(pbVar18 + 1);
    uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_38 = pbVar18 + 5;
  }
  if (uVar12 == 0) {
    return 0;
  }
  puVar16 = (undefined8 *)0x0;
  while( true ) {
    local_50 = (assoc_val *)0x0;
    index_number = (assoc_val *)0x0;
    bVar1 = *local_38;
    ptr = puVar16;
    if (mp_type_hint[bVar1] != MP_ARRAY) break;
    if ((bVar1 & 0x40) == 0) {
      pbVar18 = local_38 + 1;
    }
    else if ((bVar1 & 1) == 0) {
      pbVar18 = local_38 + 3;
    }
    else {
      pbVar18 = local_38 + 5;
    }
    bVar1 = *pbVar18;
    uVar8 = (uint)bVar1;
    switch(bVar1) {
    case 0xcc:
      uVar8 = (uint)pbVar18[1];
      pbVar19 = pbVar18 + 2;
      break;
    case 0xcd:
      pbVar19 = pbVar18 + 3;
      uVar8 = (uint)(ushort)(*(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8);
      break;
    case 0xce:
      uVar8 = *(uint *)(pbVar18 + 1);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      pbVar19 = pbVar18 + 5;
      break;
    case 0xcf:
      uVar3 = *(undefined8 *)(pbVar18 + 1);
      uVar8 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
              (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      pbVar19 = pbVar18 + 9;
      break;
    default:
      if (-1 < (char)bVar1) {
        pbVar19 = pbVar18 + 1;
        break;
      }
      goto LAB_0010af81;
    }
    index_string._4_4_ = uVar8;
    if (mp_type_hint[*pbVar19] != MP_UINT) break;
    uVar12 = uVar12 - 1;
    uVar7 = PMurHash32(0xd,(void *)((long)&index_string + 4),4);
    uVar8 = pmVar2->n_buckets;
    ppaVar15 = (assoc_val **)((ulong)uVar7 % (ulong)uVar8);
    while( true ) {
      uVar10 = (uint)ppaVar15 & 0xf;
      if ((((pmVar2->b[(ulong)ppaVar15 >> 4] >> uVar10 & 1) != 0) &&
          ((pmVar2->p[(long)ppaVar15]->key).id_len == 4)) &&
         (index_string._4_4_ == *(uint *)(pmVar2->p[(long)ppaVar15]->key).id)) goto LAB_0010acb7;
      if (((pmVar2->b[(ulong)ppaVar15 >> 4] >> (sbyte)uVar10) >> 0x10 & 1) == 0) break;
      uVar14 = (uint)ppaVar15 + uVar7 % (uVar8 - 1) + 1;
      uVar10 = uVar8;
      if (uVar14 < uVar8) {
        uVar10 = 0;
      }
      ppaVar15 = (assoc_val **)(ulong)(uVar14 - uVar10);
    }
    ppaVar15 = (assoc_val **)(ulong)uVar8;
LAB_0010acb7:
    if ((uint)ppaVar15 == uVar8) {
      return -1;
    }
    pvVar4 = pmVar2->p[(long)ppaVar15]->data;
    data = (byte **)0x10;
    puVar9 = (undefined8 *)tnt_mem_alloc(0x10);
    if (puVar9 == (undefined8 *)0x0) break;
    *puVar9 = 0;
    puVar9[1] = 0;
    bVar1 = *pbVar19;
    uVar8 = (uint)bVar1;
    ptr = puVar9;
    if (mp_type_hint[bVar1] != MP_UINT) break;
    node = &switchD_0010ad1b::switchdataD_0011d300;
    switch(bVar1) {
    case 0xcc:
      uVar8 = (uint)pbVar19[1];
      pbVar18 = pbVar19 + 2;
      break;
    case 0xcd:
      pbVar18 = pbVar19 + 3;
      uVar8 = (uint)(ushort)(*(ushort *)(pbVar19 + 1) << 8 | *(ushort *)(pbVar19 + 1) >> 8);
      break;
    case 0xce:
      uVar8 = *(uint *)(pbVar19 + 1);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      pbVar18 = pbVar19 + 5;
      break;
    case 0xcf:
      uVar3 = *(undefined8 *)(pbVar19 + 1);
      uVar8 = (uint)(byte)((ulong)uVar3 >> 0x38) | ((uint)((ulong)uVar3 >> 0x20) & 0xff0000) >> 8 |
              (uint)((ulong)uVar3 >> 0x18) & 0xff0000 | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      pbVar18 = pbVar19 + 9;
      break;
    default:
      node = (uint *)ppaVar15;
      if ((char)bVar1 < '\0') goto LAB_0010af86;
      pbVar18 = pbVar19 + 1;
    }
    *(uint *)((long)puVar9 + 0xc) = uVar8;
    bVar1 = *pbVar18;
    if (mp_type_hint[bVar1] != MP_STR) break;
    if (bVar1 == 0xdb) {
      uVar8 = *(uint *)(pbVar18 + 1);
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      pbVar19 = pbVar18 + 5;
    }
    else if (bVar1 == 0xda) {
      pbVar19 = pbVar18 + 3;
      uVar8 = (uint)(ushort)(*(ushort *)(pbVar18 + 1) << 8 | *(ushort *)(pbVar18 + 1) >> 8);
    }
    else if (bVar1 == 0xd9) {
      uVar8 = (uint)pbVar18[1];
      pbVar19 = pbVar18 + 2;
    }
    else {
      if ((byte)(bVar1 + 0x40) < 0xe0) {
        tnt_schema_add_indexes_cold_1();
LAB_0010af81:
        tnt_schema_add_indexes_cold_3();
LAB_0010af86:
        tnt_schema_add_indexes_cold_2();
        pbVar18 = *data;
        uVar7 = PMurHash32(0xd,node,len);
        uVar12 = *(uint *)(pbVar18 + 0x10);
        uVar17 = (ulong)uVar7 % (ulong)uVar12;
        lVar13 = *(long *)(pbVar18 + 8);
        while( true ) {
          uVar10 = (uint)uVar17;
          uVar8 = *(uint *)(lVar13 + (uVar17 >> 4) * 4);
          if (((((uVar8 >> (uVar10 & 0xf) & 1) != 0) &&
               (puVar16 = *(undefined8 **)(*(long *)pbVar18 + uVar17 * 8),
               *(uint *)(puVar16 + 1) == len)) &&
              (iVar6 = bcmp(node,(void *)*puVar16,(ulong)len), uVar14 = uVar10, iVar6 == 0)) ||
             (uVar14 = uVar12, ((uVar8 >> (sbyte)(uVar10 & 0xf)) >> 0x10 & 1) == 0)) break;
          uVar10 = uVar10 + uVar7 % (uVar12 - 1) + 1;
          uVar8 = uVar12;
          if (uVar10 < uVar12) {
            uVar8 = 0;
          }
          uVar17 = (ulong)(uVar10 - uVar8);
        }
        iVar6 = -1;
        if (uVar14 != uVar12) {
          iVar6 = *(int *)(*(long *)(*(long *)(*(long *)pbVar18 + (ulong)uVar14 * 8) + 0x10) + 0xc);
        }
        return iVar6;
      }
      pbVar19 = pbVar18 + 1;
      uVar8 = bVar1 & 0x1f;
    }
    *(uint *)(puVar9 + 1) = uVar8;
    __dest = tnt_mem_alloc((ulong)uVar8);
    *puVar9 = __dest;
    if (__dest == (void *)0x0) break;
    memcpy(__dest,pbVar19,(ulong)*(uint *)(puVar9 + 1));
    index_number = (assoc_val *)tnt_mem_alloc(0x18);
    if (index_number == (assoc_val *)0x0) break;
    (index_number->key).id = (char *)*puVar9;
    (index_number->key).id_len = *(uint32_t *)(puVar9 + 1);
    index_number->data = puVar9;
    local_50 = (assoc_val *)tnt_mem_alloc(0x18);
    if (local_50 == (assoc_val *)0x0) break;
    arg = (char *)((long)puVar9 + 0xc);
    (local_50->key).id = arg;
    (local_50->key).id_len = 4;
    local_50->data = puVar9;
    mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),&index_number,ret,arg);
    node = (uint *)&local_50;
    mh_assoc_put(*(mh_assoc_t **)((long)pvVar4 + 0x10),(assoc_val **)node,ret_00,arg);
    data = &local_38;
    mp_next((char **)data);
    if (uVar12 == 0) {
      return 0;
    }
  }
  lVar13 = 1;
  do {
    lVar11 = (long)""[*local_38];
    if (lVar11 < 0) {
      if (*local_38 == 0xd9) {
        local_38 = local_38 + (ulong)local_38[1] + 2;
        goto LAB_0010aebf;
      }
      if (-0x20 < ""[*local_38]) {
        lVar13 = lVar13 - lVar11;
        local_38 = local_38 + 1;
        goto LAB_0010aebf;
      }
      mp_next_slowpath((char **)&local_38,lVar13);
      bVar5 = false;
      lVar11 = lVar13;
    }
    else {
      local_38 = local_38 + 1 + lVar11;
LAB_0010aebf:
      bVar5 = true;
      lVar11 = lVar13;
    }
    if ((!bVar5) || (lVar13 = lVar11 + -1, lVar11 < 2)) {
      if (index_number != (assoc_val *)0x0) {
        tnt_mem_free(index_number);
      }
      if (local_50 != (assoc_val *)0x0) {
        tnt_mem_free(local_50);
      }
      if (ptr != (undefined8 *)0x0) {
        tnt_mem_free((void *)*ptr);
      }
      tnt_mem_free(ptr);
      return -1;
    }
  } while( true );
}

Assistant:

int tnt_schema_add_indexes(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_index(schema, &tuple))
			return -1;
	}
	return 0;
}